

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeFirst(BtCursor *pCur,int *pRes)

{
  undefined4 *in_RSI;
  BtCursor *in_RDI;
  int rc;
  BtCursor *unaff_retaddr;
  undefined4 local_14;
  
  local_14 = moveToRoot(in_RDI);
  if (local_14 == 0) {
    *in_RSI = 0;
    local_14 = moveToLeftmost(unaff_retaddr);
  }
  else if (local_14 == 0x10) {
    *in_RSI = 1;
    local_14 = 0;
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeFirst(BtCursor *pCur, int *pRes){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->pPage->nCell>0 );
    *pRes = 0;
    rc = moveToLeftmost(pCur);
  }else if( rc==SQLITE_EMPTY ){
    assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
    *pRes = 1;
    rc = SQLITE_OK;
  }
  return rc;
}